

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plurrule.cpp
# Opt level: O2

void __thiscall icu_63::AndConstraint::AndConstraint(AndConstraint *this,AndConstraint *other)

{
  UErrorCode *status;
  UErrorCode UVar1;
  int32_t iVar2;
  UVector32 *this_00;
  AndConstraint *pAVar3;
  
  this->_vptr_AndConstraint = (_func_int **)&PTR__AndConstraint_003ce7d8;
  this->op = NONE;
  this->opNum = -1;
  this->value = -1;
  this->rangeList = (UVector32 *)0x0;
  this->negated = '\0';
  this->integerOnly = '\0';
  *(undefined8 *)&this->digitsType = 0;
  *(undefined8 *)((long)&this->next + 4) = 0;
  UVar1 = other->fInternalStatus;
  this->fInternalStatus = UVar1;
  if (U_ZERO_ERROR < UVar1) {
    return;
  }
  iVar2 = other->opNum;
  this->op = other->op;
  this->opNum = iVar2;
  this->value = other->value;
  pAVar3 = other;
  if (other->rangeList != (UVector32 *)0x0) {
    status = &this->fInternalStatus;
    this_00 = (UVector32 *)UMemory::operator_new((UMemory *)0x20,(size_t)other);
    if (this_00 != (UVector32 *)0x0) {
      UVector32::UVector32(this_00,status);
    }
    if (*status < U_ILLEGAL_ARGUMENT_ERROR && this_00 == (UVector32 *)0x0) {
      *status = U_MEMORY_ALLOCATION_ERROR;
      return;
    }
    if (U_ZERO_ERROR < *status) {
      if (this_00 == (UVector32 *)0x0) {
        return;
      }
      (*(this_00->super_UObject)._vptr_UObject[1])(this_00);
      return;
    }
    this->rangeList = this_00;
    pAVar3 = (AndConstraint *)other->rangeList;
    UVector32::assign(this_00,(UVector32 *)pAVar3,status);
  }
  this->integerOnly = other->integerOnly;
  this->negated = other->negated;
  this->digitsType = other->digitsType;
  if (other->next != (AndConstraint *)0x0) {
    pAVar3 = (AndConstraint *)UMemory::operator_new((UMemory *)0x38,(size_t)pAVar3);
    if (pAVar3 == (AndConstraint *)0x0) {
      this->next = (AndConstraint *)0x0;
      this->fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
    }
    else {
      AndConstraint(pAVar3,other->next);
      this->next = pAVar3;
    }
  }
  return;
}

Assistant:

AndConstraint::AndConstraint(const AndConstraint& other) {
    this->fInternalStatus = other.fInternalStatus;
    if (U_FAILURE(fInternalStatus)) {
        return; // stop early if the object we are copying from is invalid.
    }
    this->op = other.op;
    this->opNum=other.opNum;
    this->value=other.value;
    if (other.rangeList != nullptr) {
        LocalPointer<UVector32> newRangeList(new UVector32(fInternalStatus), fInternalStatus);
        if (U_FAILURE(fInternalStatus)) {
            return;
        }
        this->rangeList = newRangeList.orphan();
        this->rangeList->assign(*other.rangeList, fInternalStatus);
    }
    this->integerOnly=other.integerOnly;
    this->negated=other.negated;
    this->digitsType = other.digitsType;
    if (other.next != nullptr) {
        this->next = new AndConstraint(*other.next);
        if (this->next == nullptr) {
            fInternalStatus = U_MEMORY_ALLOCATION_ERROR;
        }
    }
}